

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regression_suite.cpp
# Opt level: O1

void cumulative_double::run(void)

{
  undefined4 local_c;
  undefined8 local_8;
  
  local_8 = 0;
  local_c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("filter.size()","0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/regression_suite.cpp"
             ,0x1c,"void cumulative_double::test_ctor()",&local_8,&local_c);
  test_same();
  test_linear_increase();
  test_linear_increase__offset();
  test_linear_decrease();
  test_scatter();
  return;
}

Assistant:

void run()
{
    test_ctor();
    test_same();
    test_linear_increase();
    test_linear_increase__offset();
    test_linear_decrease();
    test_scatter();
}